

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_setup(mbedtls_ssl_context *ssl,mbedtls_ssl_config *conf)

{
  int iVar1;
  uchar *__ptr;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  
  ssl->conf = conf;
  __ptr = (uchar *)calloc(1,0x414d);
  ssl->in_buf = __ptr;
  if (__ptr != (uchar *)0x0) {
    puVar2 = (uchar *)calloc(1,0x414d);
    ssl->out_buf = puVar2;
    if (puVar2 != (uchar *)0x0) {
      uVar3 = *(uint *)&conf->field_0x174 & 2;
      uVar4 = (ulong)(uVar3 == 0);
      *(uchar **)(ssl->own_verify_data + (ulong)uVar3 * 4 + -0x78) = puVar2;
      *(uchar **)(ssl->own_verify_data + uVar4 * 8 + -0x78) = puVar2 + uVar4 * 5 + 3;
      ssl->out_len = puVar2 + 0xb;
      ssl->out_iv = puVar2 + 0xd;
      ssl->out_msg = puVar2 + 0xd;
      *(uchar **)((long)&ssl->in_ctr + (ulong)uVar3 * 4) = __ptr;
      (&ssl->in_ctr)[uVar4] = __ptr + uVar4 * 5 + 3;
      ssl->in_len = __ptr + 0xb;
      ssl->in_iv = __ptr + 0xd;
      ssl->in_msg = __ptr + 0xd;
      iVar1 = ssl_handshake_init(ssl);
      return iVar1;
    }
  }
  free(__ptr);
  ssl->in_buf = (uchar *)0x0;
  return -0x7f00;
}

Assistant:

int mbedtls_ssl_setup( mbedtls_ssl_context *ssl,
                       const mbedtls_ssl_config *conf )
{
    int ret;
    const size_t len = MBEDTLS_SSL_BUFFER_LEN;

    ssl->conf = conf;

    /*
     * Prepare base structures
     */
    if( ( ssl-> in_buf = mbedtls_calloc( 1, len ) ) == NULL ||
        ( ssl->out_buf = mbedtls_calloc( 1, len ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed", len ) );
        mbedtls_free( ssl->in_buf );
        ssl->in_buf = NULL;
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->out_hdr = ssl->out_buf;
        ssl->out_ctr = ssl->out_buf +  3;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_hdr = ssl->in_buf;
        ssl->in_ctr = ssl->in_buf +  3;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }
    else
#endif
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf +  8;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_ctr = ssl->in_buf;
        ssl->in_hdr = ssl->in_buf +  8;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }

    if( ( ret = ssl_handshake_init( ssl ) ) != 0 )
        return( ret );

    return( 0 );
}